

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSubstGroupFree(xmlSchemaSubstGroupPtr group)

{
  xmlSchemaItemListPtr pxVar1;
  
  if (group != (xmlSchemaSubstGroupPtr)0x0) {
    pxVar1 = group->members;
    if (pxVar1 != (xmlSchemaItemListPtr)0x0) {
      if (pxVar1->items != (void **)0x0) {
        (*xmlFree)(pxVar1->items);
      }
      (*xmlFree)(pxVar1);
    }
    (*xmlFree)(group);
    return;
  }
  return;
}

Assistant:

static void
xmlSchemaSubstGroupFree(xmlSchemaSubstGroupPtr group)
{
    if (group == NULL)
	return;
    if (group->members != NULL)
	xmlSchemaItemListFree(group->members);
    xmlFree(group);
}